

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void __thiscall
spirv_cross::SPIRConstant::SPIRConstant
          (SPIRConstant *this,TypeID constant_type_,uint32_t *elements,uint32_t num_elements,
          bool specialized)

{
  undefined8 *puVar1;
  uint32_t uVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_0035b4c0;
  *(uint32_t *)&(this->super_IVariant).field_0xc = constant_type_.id;
  lVar4 = 0;
  do {
    puVar1 = (undefined8 *)((long)&(this->m).c[0].id[0].id + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)((this->m).c[0].id + 4) + lVar4) = 1;
    puVar1 = (undefined8 *)((long)(this->m).c[0].r + lVar4);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->m).c[0].r + lVar4 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar4 = lVar4 + 0x38;
  } while (lVar4 != 0xe0);
  (this->m).id[0] = 0;
  (this->m).id[1] = 0;
  (this->m).id[2] = 0;
  (this->m).id[3] = 0;
  (this->m).columns = 1;
  this->specialization = specialized;
  this->is_used_as_array_length = false;
  this->is_used_as_lut = false;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
       (TypedID<(spirv_cross::Types)3> *)0x0;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size =
       0;
  (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
       (TypedID<(spirv_cross::Types)3> *)&(this->subconstants).stack_storage;
  (this->subconstants).buffer_capacity = 8;
  (this->specialization_constant_macro_name)._M_dataplus._M_p =
       (pointer)&(this->specialization_constant_macro_name).field_2;
  (this->specialization_constant_macro_name)._M_string_length = 0;
  (this->specialization_constant_macro_name).field_2._M_local_buf[0] = '\0';
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::reserve
            (&this->subconstants,(ulong)num_elements);
  if (num_elements != 0) {
    uVar5 = 0;
    do {
      uVar2 = elements[uVar5];
      SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::reserve
                (&this->subconstants,
                 (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>
                 .buffer_size + 1);
      sVar3 = (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
              buffer_size;
      (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr[sVar3]
      .id = uVar2;
      (this->subconstants).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
      buffer_size = sVar3 + 1;
      uVar5 = uVar5 + 1;
    } while (num_elements != uVar5);
  }
  this->specialization = specialized;
  return;
}

Assistant:

SPIRConstant(TypeID constant_type_, const uint32_t *elements, uint32_t num_elements, bool specialized)
	    : constant_type(constant_type_)
	    , specialization(specialized)
	{
		subconstants.reserve(num_elements);
		for (uint32_t i = 0; i < num_elements; i++)
			subconstants.push_back(elements[i]);
		specialization = specialized;
	}